

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void parse_constant_table
               (Context *ctx,uint32 *tokens,uint32 bytes,uint32 okay_version,int setvariables,
               CtabData *ctab)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint name_00;
  uint32 pos;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint32 *start_00;
  MOJOSHADER_symbol *pMVar8;
  uint *puVar9;
  VariableList *pVVar10;
  char *pcVar11;
  MOJOSHADER_symbol *sym;
  char *namecpy;
  VariableList *item;
  MOJOSHADER_uniformType mojotype;
  uint32 defval;
  uint32 typeinf;
  uint16 regcnt;
  uint16 regidx;
  uint16 regset;
  uint32 name;
  uint8 *ptr;
  uint32 i;
  uint32 target;
  uint32 constantinfo;
  uint32 constants;
  uint32 version;
  uint32 creator;
  uint32 size;
  uint8 *start;
  uint32 id;
  CtabData *ctab_local;
  int setvariables_local;
  uint32 okay_version_local;
  uint32 bytes_local;
  uint32 *tokens_local;
  Context *ctx_local;
  
  if (tokens[1] == 0x42415443) {
    if (ctab->have_ctab == 0) {
      ctab->have_ctab = 1;
      start_00 = tokens + 2;
      if (bytes < 0x20) {
        fail(ctx,"Truncated CTAB data");
      }
      else {
        uVar2 = tokens[5];
        uVar3 = tokens[6];
        if ((((tokens[2] == 0x1c) && (uVar2 < 0xf4241)) && (tokens[4] == okay_version)) &&
           (((tokens[3] < bytes && (uVar3 < bytes)) &&
            ((uVar2 * 0x14 <= bytes - uVar3 &&
             ((tokens[8] < bytes &&
              (iVar7 = parse_ctab_string((uint8 *)start_00,bytes,tokens[8]), iVar7 != 0)))))))) {
          ctab->symbols = (MOJOSHADER_symbol *)0x0;
          if (uVar2 != 0) {
            pMVar8 = (MOJOSHADER_symbol *)Malloc(ctx,(ulong)uVar2 * 0x38);
            ctab->symbols = pMVar8;
            if (ctab->symbols == (MOJOSHADER_symbol *)0x0) {
              return;
            }
            memset(ctab->symbols,0,(ulong)uVar2 * 0x38);
          }
          ctab->symbol_count = uVar2;
          for (ptr._4_4_ = 0; ptr._4_4_ < uVar2; ptr._4_4_ = ptr._4_4_ + 1) {
            puVar9 = (uint *)((long)start_00 + (ulong)(ptr._4_4_ * 0x14) + (ulong)uVar3);
            name_00 = *puVar9;
            uVar5 = puVar9[1];
            uVar1 = *(ushort *)((long)puVar9 + 6);
            uVar6 = puVar9[2];
            pos = puVar9[3];
            uVar4 = puVar9[4];
            item._0_4_ = MOJOSHADER_UNIFORM_UNKNOWN;
            iVar7 = parse_ctab_string((uint8 *)start_00,bytes,name_00);
            if ((iVar7 == 0) || (bytes <= uVar4)) goto switchD_00111901_default;
            switch((ushort)uVar5) {
            case 0:
              item._0_4_ = MOJOSHADER_UNIFORM_BOOL;
              break;
            case 1:
              item._0_4_ = MOJOSHADER_UNIFORM_INT;
              break;
            case 2:
              item._0_4_ = MOJOSHADER_UNIFORM_FLOAT;
              break;
            case 3:
              break;
            default:
              goto switchD_00111901_default;
            }
            if (((setvariables != 0) && ((MOJOSHADER_uniformType)item != MOJOSHADER_UNIFORM_UNKNOWN)
                ) && (pVVar10 = (VariableList *)Malloc(ctx,0x28), pVVar10 != (VariableList *)0x0)) {
              pVVar10->type = (MOJOSHADER_uniformType)item;
              pVVar10->index = (uint)uVar1;
              pVVar10->count = (uint)(ushort)uVar6;
              pVVar10->constant = (ConstantsList *)0x0;
              pVVar10->used = 0;
              pVVar10->emit_position = -1;
              pVVar10->next = ctx->variables;
              ctx->variables = pVVar10;
            }
            pcVar11 = StrDup(ctx,(char *)((long)start_00 + (ulong)name_00));
            if (pcVar11 == (char *)0x0) {
              return;
            }
            pMVar8 = ctab->symbols + ptr._4_4_;
            pMVar8->name = pcVar11;
            pMVar8->register_set = (uint)(ushort)uVar5;
            pMVar8->register_index = (uint)uVar1;
            pMVar8->register_count = (uint)(ushort)uVar6;
            iVar7 = parse_ctab_typeinfo(ctx,(uint8 *)start_00,bytes,pos,&pMVar8->info,0);
            if (iVar7 == 0) goto switchD_00111901_default;
            if (ctx->out_of_memory != 0) {
              return;
            }
          }
        }
        else {
switchD_00111901_default:
          fail(ctx,"Shader has corrupt CTAB data");
        }
      }
    }
    else {
      fail(ctx,"Shader has multiple CTAB sections");
    }
  }
  return;
}

Assistant:

static void parse_constant_table(Context *ctx, const uint32 *tokens,
                                 const uint32 bytes, const uint32 okay_version,
                                 const int setvariables, CtabData *ctab)
{
    const uint32 id = SWAP32(tokens[1]);
    if (id != CTAB_ID)
        return;  // not the constant table.

    if (ctab->have_ctab)  // !!! FIXME: can you have more than one?
    {
        fail(ctx, "Shader has multiple CTAB sections");
        return;
    } // if

    ctab->have_ctab = 1;

    const uint8 *start = (uint8 *) &tokens[2];

    if (bytes < 32)
    {
        fail(ctx, "Truncated CTAB data");
        return;
    } // if

    const uint32 size = SWAP32(tokens[2]);
    const uint32 creator = SWAP32(tokens[3]);
    const uint32 version = SWAP32(tokens[4]);
    const uint32 constants = SWAP32(tokens[5]);
    const uint32 constantinfo = SWAP32(tokens[6]);
    const uint32 target = SWAP32(tokens[8]);

    if (size != CTAB_SIZE)
        goto corrupt_ctab;
    else if (constants > 1000000)  // sanity check.
        goto corrupt_ctab;

    if (version != okay_version) goto corrupt_ctab;
    if (creator >= bytes) goto corrupt_ctab;
    if (constantinfo >= bytes) goto corrupt_ctab;
    if ((bytes - constantinfo) < (constants * CINFO_SIZE)) goto corrupt_ctab;
    if (target >= bytes) goto corrupt_ctab;
    if (!parse_ctab_string(start, bytes, target)) goto corrupt_ctab;
    // !!! FIXME: check that (start+target) points to "ps_3_0", etc.

    ctab->symbols = NULL;
    if (constants > 0)
    {
        ctab->symbols = (MOJOSHADER_symbol *) Malloc(ctx, sizeof (MOJOSHADER_symbol) * constants);
        if (ctab->symbols == NULL)
            return;
        memset(ctab->symbols, '\0', sizeof (MOJOSHADER_symbol) * constants);
    } // if
    ctab->symbol_count = constants;

    uint32 i = 0;
    for (i = 0; i < constants; i++)
    {
        const uint8 *ptr = start + constantinfo + (i * CINFO_SIZE);
        const uint32 name = SWAP32(*((uint32 *) (ptr + 0)));
        const uint16 regset = SWAP16(*((uint16 *) (ptr + 4)));
        const uint16 regidx = SWAP16(*((uint16 *) (ptr + 6)));
        const uint16 regcnt = SWAP16(*((uint16 *) (ptr + 8)));
        const uint32 typeinf = SWAP32(*((uint32 *) (ptr + 12)));
        const uint32 defval = SWAP32(*((uint32 *) (ptr + 16)));
        MOJOSHADER_uniformType mojotype = MOJOSHADER_UNIFORM_UNKNOWN;

        if (!parse_ctab_string(start, bytes, name)) goto corrupt_ctab;
        if (defval >= bytes) goto corrupt_ctab;

        switch (regset)
        {
            case 0: mojotype = MOJOSHADER_UNIFORM_BOOL; break;
            case 1: mojotype = MOJOSHADER_UNIFORM_INT; break;
            case 2: mojotype = MOJOSHADER_UNIFORM_FLOAT; break;
            case 3: /* SAMPLER */ break;
            default: goto corrupt_ctab;
        } // switch

        if ((setvariables) && (mojotype != MOJOSHADER_UNIFORM_UNKNOWN))
        {
            VariableList *item;
            item = (VariableList *) Malloc(ctx, sizeof (VariableList));
            if (item != NULL)
            {
                item->type = mojotype;
                item->index = regidx;
                item->count = regcnt;
                item->constant = NULL;
                item->used = 0;
                item->emit_position = -1;
                item->next = ctx->variables;
                ctx->variables = item;
            } // if
        } // if

        // Add the symbol.
        const char *namecpy = StrDup(ctx, (const char *) (start + name));
        if (namecpy == NULL)
            return;

        MOJOSHADER_symbol *sym = &ctab->symbols[i];
        sym->name = namecpy;
        sym->register_set = (MOJOSHADER_symbolRegisterSet) regset;
        sym->register_index = (unsigned int) regidx;
        sym->register_count = (unsigned int) regcnt;
        if (!parse_ctab_typeinfo(ctx, start, bytes, typeinf, &sym->info, 0))
            goto corrupt_ctab;  // sym->name will get free()'d later.
        else if (ctx->out_of_memory)
            return;  // just bail now.
    } // for

    return;

corrupt_ctab:
    fail(ctx, "Shader has corrupt CTAB data");
}